

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

short duckdb::BinaryNumericDivideWrapper::Operation<bool,duckdb::DivideOperator,short,short,short>
                (bool fun,short left,short right,ValidityMask *mask,idx_t idx)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  TemplatedValidityData<unsigned_long> *pTVar4;
  _Head_base<0UL,_unsigned_long_*,_false> _Var5;
  OutOfRangeException *this_00;
  string local_58;
  idx_t local_38;
  
  if (right != -1 || left != -0x8000) {
    if (right == 0) {
      _Var5._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (_Var5._M_head_impl == (unsigned_long *)0x0) {
        local_38 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)&local_58,&local_38);
        sVar3 = local_58._M_string_length;
        _Var2._M_p = local_58._M_dataplus._M_p;
        local_58._M_dataplus._M_p = (pointer)0x0;
        local_58._M_string_length = 0;
        this = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
        (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)_Var2._M_p;
        (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
          }
        }
        pTVar4 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                           (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
        _Var5._M_head_impl =
             (pTVar4->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var5._M_head_impl;
      }
      bVar1 = (byte)idx & 0x3f;
      _Var5._M_head_impl[idx >> 6] =
           _Var5._M_head_impl[idx >> 6] & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
    }
    else {
      left = left / right;
    }
    return left;
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Overflow in division of %d / %d","");
  OutOfRangeException::OutOfRangeException<short,short>(this_00,&local_58,-0x8000,-1);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		if (left == NumericLimits<LEFT_TYPE>::Minimum() && right == -1) {
			throw OutOfRangeException("Overflow in division of %d / %d", left, right);
		} else if (right == 0) {
			mask.SetInvalid(idx);
			return left;
		} else {
			return OP::template Operation<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(left, right);
		}
	}